

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

void __thiscall libchars::command_cursor::rewind(command_cursor *this,FILE *__stream)

{
  long lVar1;
  _Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *p_Var2;
  command_cursor *pcVar3;
  byte bVar4;
  undefined1 auStack_88 [8];
  command_node_stack_t empty;
  
  bVar4 = 0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
  _M_initialize_map((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                     *)auStack_88,0);
  auStack_88 = (undefined1  [8])
               (this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_map;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_map_size;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)auStack_88;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size =
       (size_t)(this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur =
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first =
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node =
       (_Map_pointer)
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur =
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first =
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  empty.c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       (this->S).c.
       super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  p_Var2 = (_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
           auStack_88;
  pcVar3 = this;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pcVar3->S).c.
    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl.
    super__Deque_impl_data._M_map = (p_Var2->_M_impl).super__Deque_impl_data._M_map;
    p_Var2 = (_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
             ((long)p_Var2 + ((ulong)bVar4 * -2 + 1) * 8);
    pcVar3 = (command_cursor *)((long)pcVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->w)._M_string_length = 0;
  *(this->w)._M_dataplus._M_p = '\0';
  this->idx = 0;
  std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
  ~_Deque_base((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
               auStack_88);
  return;
}

Assistant:

void command_cursor::rewind()
    {
        command_node_stack_t empty;
        std::swap(S,empty);
        w.clear();
        idx = 0;
    }